

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popup_inter.cpp
# Opt level: O0

void popup_inter_start_do_proc
               (Am_Object *inter,int x,int y,Am_Object *ref_obj,Am_Input_Char param_5)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object local_80;
  Am_Object local_78;
  Am_Input_Char local_6c;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object sub_inter;
  Am_Object main_win;
  Am_Object local_30;
  Am_Object sub_menu_window;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  Am_Object *inter_local;
  Am_Input_Char param_4_local;
  
  sub_menu_window.data = (Am_Object_Data *)ref_obj;
  ref_obj_local._0_4_ = y;
  ref_obj_local._4_4_ = x;
  _y_local = inter;
  inter_local._4_4_ = param_5;
  pAVar2 = Am_Object::Get(inter,0x1d2,0);
  Am_Object::Am_Object(&local_30,pAVar2);
  bVar1 = Am_Object::Valid(&local_30);
  if (bVar1) {
    Am_Translate_Coordinates
              (ref_obj,ref_obj_local._4_4_,(int)ref_obj_local,&Am_Screen,
               (int *)((long)&ref_obj_local + 4),(int *)&ref_obj_local);
    Am_Object::Set(&local_30,100,ref_obj_local._4_4_,0);
    Am_Object::Set(&local_30,0x65,(int)ref_obj_local,0);
    pAVar2 = Am_Object::Get(inter,0x68,0);
    Am_Object::Am_Object(&sub_inter,pAVar2);
    set_popup_win_visible(&local_30,true,&sub_inter);
    Am_Object::Get_Object(&local_58,(Am_Slot_Key)&local_30,0x1d2);
    Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_58,0x1ac);
    Am_Object::~Am_Object(&local_58);
    Am_Object::Am_Object(&local_60,&local_50);
    Am_Object::Am_Object(&local_68,&Am_No_Object);
    local_6c = Am_Default_Start_Char;
    Am_Object::Am_Object(&local_78,&Am_No_Object);
    Am_Start_Interactor(&local_60,&local_68,local_6c,&local_78,0,0,true);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object(&local_50);
    Am_Object::~Am_Object(&sub_inter);
  }
  Am_Object::Am_Object(&local_80,inter);
  Am_Abort_Interactor(&local_80,true);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Mouse_Event_Method, void, popup_inter_start_do,
                 (Am_Object inter, int x, int y, Am_Object ref_obj,
                  Am_Input_Char /* ic */))
{
  Am_Object sub_menu_window = inter.Get(Am_SUB_MENU);
  if (sub_menu_window.Valid()) {
    Am_Translate_Coordinates(ref_obj, x, y, Am_Screen, x, y);
    sub_menu_window.Set(Am_LEFT, x);
    sub_menu_window.Set(Am_TOP, y);
    Am_Object main_win = inter.Get(Am_WINDOW);
    set_popup_win_visible(sub_menu_window, true, main_win);
    Am_Object sub_inter =
        sub_menu_window.Get_Object(Am_SUB_MENU).Get_Object(Am_INTERACTOR);
    Am_Start_Interactor(sub_inter);
  }
  Am_Abort_Interactor(inter); //so the do method isn't called on start
}